

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

void lws_wsi_mux_dump_children(lws *wsi)

{
  lws_role_ops *plVar1;
  lws *plVar2;
  int iVar3;
  char *pcVar4;
  lws **pplVar5;
  
  if ((wsi->mux).parent_wsi != (lws *)0x0) {
    iVar3 = lwsl_visible(8);
    if (iVar3 != 0) {
      pplVar5 = &(((wsi->mux).parent_wsi)->mux).child_list;
      while (*pplVar5 != (lws *)0x0) {
        plVar1 = (*pplVar5)->role_ops;
        pcVar4 = "?";
        if (plVar1 != (lws_role_ops *)0x0) {
          pcVar4 = plVar1->name;
        }
        _lws_log(8,"   \\---- child %s %p\n",pcVar4);
        plVar2 = *pplVar5;
        pplVar5 = &(plVar2->mux).sibling_list;
        if (plVar2 == (plVar2->mux).sibling_list) {
          __assert_fail("*w != (*w)->mux.sibling_list",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/wsi.c"
                        ,0x450,"void lws_wsi_mux_dump_children(struct lws *)");
        }
      }
    }
  }
  return;
}

Assistant:

void
lws_wsi_mux_dump_children(struct lws *wsi)
{
#if defined(_DEBUG)
	if (!wsi->mux.parent_wsi || !lwsl_visible(LLL_INFO))
		return;

	lws_start_foreach_llp(struct lws **, w,
			      wsi->mux.parent_wsi->mux.child_list) {
		lwsl_info("   \\---- child %s %p\n",
			  (*w)->role_ops ? (*w)->role_ops->name : "?", *w);
		assert(*w != (*w)->mux.sibling_list);
	} lws_end_foreach_llp(w, mux.sibling_list);
#endif
}